

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void resume(result *result,ostream *os)

{
  pointer psVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  solution *elem;
  pointer psVar12;
  long lVar13;
  long lVar14;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_01;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_02;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_03;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_04;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_05;
  double local_58;
  undefined8 local_50;
  ulong local_48;
  
  fmt::v7::
  print<char[174],std::basic_string_view<char,std::char_traits<char>>const&,int_const&,int_const&,double_const&,long_const&,char>
            (os,(char (*) [174])
                "\\ solver................: {}\n\\ constraints...........: {}\n\\ variables.............: {}\n\\ duration..............: {:f}\n\\ loop..................: {}\n\\ status................: "
             ,&result->method,&result->constraints,&result->variables,&result->duration,
             &result->loop);
  switch(result->status) {
  case success:
    local_58 = 0.0;
    format_str.size_ = 0xf;
    format_str.data_ = "solution found\n";
    auVar5._8_8_ = 0;
    auVar5._0_8_ = &local_58;
    fmt::v7::vprint<char>
              (os,format_str,
               (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                )(auVar5 << 0x40));
    psVar12 = (result->solutions).
              super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((result->solutions).
        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
        super__Vector_impl_data._M_start != psVar12) {
      local_58 = psVar12[-1].value;
      format_str_00.size_ = 0x39;
      format_str_00.data_ = "\\ value.................: {:f}\n\\ other value...........: ";
      args.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_58;
      args.desc_ = 10;
      fmt::v7::vprint<char>(os,format_str_00,args);
      psVar12 = (result->solutions).
                super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
                super__Vector_impl_data._M_start;
      psVar1 = (result->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (psVar12 != psVar1) {
        do {
          local_58 = psVar12->value;
          format_str_01.size_ = 3;
          format_str_01.data_ = "{} ";
          args_00.field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&local_58;
          args_00.desc_ = 10;
          fmt::v7::vprint<char>(os,format_str_01,args_00);
          psVar12 = psVar12 + 1;
        } while (psVar12 != psVar1);
      }
      local_58 = 0.0;
      format_str_02.size_ = 1;
      format_str_02.data_ = "\n";
      auVar6._8_8_ = 0;
      auVar6._0_8_ = &local_58;
      fmt::v7::vprint<char>
                (os,format_str_02,
                 (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  )(auVar6 << 0x40));
      local_58 = 0.0;
      format_str_03.size_ = 0x1b;
      format_str_03.data_ = "\\ variables.............: \n";
      auVar7._8_8_ = 0;
      auVar7._0_8_ = &local_58;
      fmt::v7::vprint<char>
                (os,format_str_03,
                 (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  )(auVar7 << 0x40));
      lVar13 = (long)(result->affected_vars).names.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(result->affected_vars).names.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar13 != 0) {
        lVar11 = 8;
        lVar14 = 0;
        do {
          pbVar2 = (result->affected_vars).names.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_48 = (ulong)((result->affected_vars).values.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar14] != '\0');
          local_50 = *(undefined8 *)((long)pbVar2 + lVar11 + -8);
          local_58 = *(double *)((long)&pbVar2->_M_len + lVar11);
          format_str_04.size_ = 6;
          format_str_04.data_ = "{}={}\n";
          args_01.field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&local_58;
          args_01.desc_ = 0x1d;
          fmt::v7::vprint<char>(os,format_str_04,args_01);
          lVar14 = lVar14 + 1;
          lVar11 = lVar11 + 0x10;
        } while (lVar13 >> 4 != lVar14);
      }
      psVar12 = (result->solutions).
                super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pcVar3 = psVar12[-1].variables.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar4 = psVar12[-1].variables.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pcVar3 != pcVar4) {
        lVar13 = 8;
        lVar11 = 0;
        do {
          pbVar2 = (result->variable_name).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_48 = (ulong)((result->solutions).
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].variables.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar11] != '\0');
          local_50 = *(undefined8 *)((long)pbVar2 + lVar13 + -8);
          local_58 = *(double *)((long)&pbVar2->_M_len + lVar13);
          format_str_05.size_ = 6;
          format_str_05.data_ = "{}={}\n";
          args_02.field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&local_58;
          args_02.desc_ = 0x1d;
          fmt::v7::vprint<char>(os,format_str_05,args_02);
          lVar11 = lVar11 + 1;
          lVar13 = lVar13 + 0x10;
        } while ((long)pcVar3 - (long)pcVar4 != lVar11);
      }
    }
    break;
  case internal_error:
    local_58 = 0.0;
    format_str_09.size_ = 0x18;
    format_str_09.data_ = "internal error reported\n";
    auVar9._8_8_ = 0;
    auVar9._0_8_ = &local_58;
    fmt::v7::vprint<char>
              (os,format_str_09,
               (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                )(auVar9 << 0x40));
    break;
  case uninitialized:
    local_58 = 0.0;
    format_str_07.size_ = 0xe;
    format_str_07.data_ = "uninitialized\n";
    auVar8._8_8_ = 0;
    auVar8._0_8_ = &local_58;
    fmt::v7::vprint<char>
              (os,format_str_07,
               (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                )(auVar8 << 0x40));
    break;
  case time_limit_reached:
    local_58 = (double)(ulong)(uint)result->remaining_constraints;
    format_str_08.size_ = 0x30;
    format_str_08.data_ = "time limit reached\n\\ remaining constraints.: {}\n";
    args_04.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_58;
    args_04.desc_ = 1;
    fmt::v7::vprint<char>(os,format_str_08,args_04);
    break;
  case kappa_max_reached:
    local_58 = (double)(ulong)(uint)result->remaining_constraints;
    format_str_06.size_ = 0x2f;
    format_str_06.data_ = "kappa max reached\n\\ remaining constraints.: {}\n";
    args_03.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_58;
    args_03.desc_ = 1;
    fmt::v7::vprint<char>(os,format_str_06,args_03);
    break;
  case limit_reached:
    local_58 = (double)(ulong)(uint)result->remaining_constraints;
    format_str_10.size_ = 0x2b;
    format_str_10.data_ = "limit reached\n\\ remaining constraints.: {}\n";
    args_05.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_58;
    args_05.desc_ = 1;
    fmt::v7::vprint<char>(os,format_str_10,args_05);
    break;
  case empty_context:
    local_58 = 0.0;
    format_str_11.size_ = 0x16;
    format_str_11.data_ = "context uninitialized\n";
    auVar10._8_8_ = 0;
    auVar10._0_8_ = &local_58;
    fmt::v7::vprint<char>
              (os,format_str_11,
               (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                )(auVar10 << 0x40));
  }
  return;
}

Assistant:

static void
resume(const baryonyx::result& result, std::ostream& os) noexcept
{
    fmt::print(os,
               "\\ solver................: {}\n"
               "\\ constraints...........: {}\n"
               "\\ variables.............: {}\n"
               "\\ duration..............: {:f}\n"
               "\\ loop..................: {}\n"
               "\\ status................: ",
               result.method,
               result.constraints,
               result.variables,
               result.duration,
               result.loop);

    switch (result.status) {
    case baryonyx::result_status::internal_error:
        fmt::print(os, "internal error reported\n");
        break;
    case baryonyx::result_status::uninitialized:
        fmt::print(os, "uninitialized\n");
        break;
    case baryonyx::result_status::success:
        fmt::print(os, "solution found\n");

        if (result.solutions.empty()) // Baryonyx ensures solutions are not
            break;                    // empty.

        fmt::print(os,
                   "\\ value.................: {:f}\n"
                   "\\ other value...........: ",
                   result.solutions.back().value);

        for (const auto& elem : result.solutions)
            fmt::print(os, "{} ", elem.value);
        fmt::print(os, "\n");
        fmt::print(os, "\\ variables.............: \n");

        for (std::size_t i{ 0 }, e{ result.affected_vars.names.size() };
             i != e;
             ++i)
            fmt::print(os,
                       "{}={}\n",
                       result.affected_vars.names[i],
                       (result.affected_vars.values[i] ? 1 : 0));

        for (std::size_t i{ 0 }, e{ result.solutions.back().variables.size() };
             i != e;
             ++i)
            fmt::print(os,
                       "{}={}\n",
                       result.variable_name[i],
                       (result.solutions.back().variables[i] ? 1 : 0));

        break;
    case baryonyx::result_status::time_limit_reached:
        fmt::print(os,
                   "time limit reached\n"
                   "\\ remaining constraints.: {}\n",
                   result.remaining_constraints);
        break;
    case baryonyx::result_status::kappa_max_reached:
        fmt::print(os,
                   "kappa max reached\n"
                   "\\ remaining constraints.: {}\n",
                   result.remaining_constraints);
        break;
    case baryonyx::result_status::limit_reached:
        fmt::print(os,
                   "limit reached\n"
                   "\\ remaining constraints.: {}\n",
                   result.remaining_constraints);
        break;
    case baryonyx::result_status::empty_context:
        fmt::print(os, "context uninitialized\n");
        break;
    }
}